

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reporter.cc
# Opt level: O0

void benchmark::BenchmarkReporter::ComputeStats
               (vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                *reports,Run *mean_data,Run *stddev_data)

{
  long lVar1;
  ulong uVar2;
  Run *this;
  bool bVar3;
  __type_conflict _Var4;
  size_type sVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  double dVar8;
  ostream *local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  ulong local_180;
  size_t i;
  Stat1<double,_long> local_158;
  Stat1<double,_long> local_140;
  double local_128;
  Stat1<double,_long> local_120;
  double local_108;
  Stat1<double,_long> local_100;
  byte local_e1;
  CheckHandler local_e0;
  byte local_d1;
  CheckHandler local_d0;
  reference local_c8;
  Run *run;
  const_iterator __end1;
  const_iterator __begin1;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  *__range1;
  int64_t run_iterations;
  Stat1_d items_per_second_stat;
  Stat1_d bytes_per_second_stat;
  Stat1_d cpu_accumulated_time_stat;
  Stat1_d real_accumulated_time_stat;
  CheckHandler local_28;
  Run *local_20;
  Run *stddev_data_local;
  Run *mean_data_local;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  *reports_local;
  
  local_20 = stddev_data;
  stddev_data_local = mean_data;
  mean_data_local = (Run *)reports;
  sVar5 = std::
          vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          ::size(reports);
  if (sVar5 < 2) {
    internal::CheckHandler::CheckHandler
              (&local_28,"reports.size() >= 2",
               "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/reporter.cc"
               ,"ComputeStats",0x1c);
    local_1a8 = internal::CheckHandler::GetLog(&local_28);
  }
  else {
    local_1a8 = internal::GetNullLogInstance();
  }
  std::operator<<(local_1a8,"Cannot compute stats for less than 2 reports");
  if (sVar5 < 2) {
    internal::CheckHandler::~CheckHandler(&local_28);
  }
  Stat1<double,_long>::Stat1((Stat1<double,_long> *)&cpu_accumulated_time_stat.sum_squares_);
  Stat1<double,_long>::Stat1((Stat1<double,_long> *)&bytes_per_second_stat.sum_squares_);
  Stat1<double,_long>::Stat1((Stat1<double,_long> *)&items_per_second_stat.sum_squares_);
  Stat1<double,_long>::Stat1((Stat1<double,_long> *)&run_iterations);
  pvVar6 = std::
           vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
           ::front((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                    *)mean_data_local);
  this = mean_data_local;
  lVar1 = pvVar6->iterations;
  __end1 = std::
           vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
           ::begin(mean_data_local);
  run = (Run *)std::
               vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
               ::end((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                      *)this);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_benchmark::BenchmarkReporter::Run_*,_std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>_>
                                *)&run);
    if (!bVar3) break;
    local_c8 = __gnu_cxx::
               __normal_iterator<const_benchmark::BenchmarkReporter::Run_*,_std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>_>
               ::operator*(&__end1);
    pvVar6 = std::
             vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
             ::operator[]((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                           *)mean_data_local,0);
    _Var4 = std::operator==(&pvVar6->benchmark_name,&local_c8->benchmark_name);
    local_d1 = 0;
    if (_Var4) {
      internal::GetNullLogInstance();
    }
    else {
      internal::CheckHandler::CheckHandler
                (&local_d0,"(reports[0].benchmark_name) == (run.benchmark_name)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/reporter.cc"
                 ,"ComputeStats",0x28);
      local_d1 = 1;
      internal::CheckHandler::GetLog(&local_d0);
    }
    if ((local_d1 & 1) != 0) {
      internal::CheckHandler::~CheckHandler(&local_d0);
    }
    local_e1 = 0;
    if (lVar1 == local_c8->iterations) {
      internal::GetNullLogInstance();
    }
    else {
      internal::CheckHandler::CheckHandler
                (&local_e0,"(run_iterations) == (run.iterations)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/reporter.cc"
                 ,"ComputeStats",0x29);
      local_e1 = 1;
      internal::CheckHandler::GetLog(&local_e0);
    }
    if ((local_e1 & 1) != 0) {
      internal::CheckHandler::~CheckHandler(&local_e0);
    }
    local_108 = local_c8->real_accumulated_time / (double)local_c8->iterations;
    Stat1<double,_long>::Stat1(&local_100,&local_108,&local_c8->iterations);
    Stat1<double,_long>::operator+=
              ((Stat1<double,_long> *)&cpu_accumulated_time_stat.sum_squares_,&local_100);
    local_128 = local_c8->cpu_accumulated_time / (double)local_c8->iterations;
    Stat1<double,_long>::Stat1(&local_120,&local_128,&local_c8->iterations);
    Stat1<double,_long>::operator+=
              ((Stat1<double,_long> *)&bytes_per_second_stat.sum_squares_,&local_120);
    Stat1<double,_long>::Stat1(&local_140,&local_c8->items_per_second,&local_c8->iterations);
    Stat1<double,_long>::operator+=((Stat1<double,_long> *)&run_iterations,&local_140);
    Stat1<double,_long>::Stat1(&local_158,&local_c8->bytes_per_second,&local_c8->iterations);
    Stat1<double,_long>::operator+=
              ((Stat1<double,_long> *)&items_per_second_stat.sum_squares_,&local_158);
    __gnu_cxx::
    __normal_iterator<const_benchmark::BenchmarkReporter::Run_*,_std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>_>
    ::operator++(&__end1);
  }
  pvVar6 = std::
           vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
           ::operator[]((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                         *)mean_data_local,0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                 &pvVar6->benchmark_name,"_mean");
  std::__cxx11::string::operator=((string *)stddev_data_local,(string *)&i);
  std::__cxx11::string::~string((string *)&i);
  stddev_data_local->iterations = lVar1;
  dVar8 = Stat1<double,_long>::Mean((Stat1<double,_long> *)&cpu_accumulated_time_stat.sum_squares_);
  stddev_data_local->real_accumulated_time = dVar8 * (double)lVar1;
  dVar8 = Stat1<double,_long>::Mean((Stat1<double,_long> *)&bytes_per_second_stat.sum_squares_);
  stddev_data_local->cpu_accumulated_time = dVar8 * (double)lVar1;
  dVar8 = Stat1<double,_long>::Mean((Stat1<double,_long> *)&items_per_second_stat.sum_squares_);
  stddev_data_local->bytes_per_second = dVar8;
  dVar8 = Stat1<double,_long>::Mean((Stat1<double,_long> *)&run_iterations);
  stddev_data_local->items_per_second = dVar8;
  pvVar6 = std::
           vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
           ::operator[]((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                         *)mean_data_local,0);
  std::__cxx11::string::operator=
            ((string *)&stddev_data_local->report_label,(string *)&pvVar6->report_label);
  local_180 = 1;
  do {
    uVar2 = local_180;
    sVar5 = std::
            vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
            ::size((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                    *)mean_data_local);
    if (sVar5 <= uVar2) {
LAB_0011bbd4:
      pvVar6 = std::
               vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
               ::operator[]((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                             *)mean_data_local,0);
      std::operator+(&local_1a0,&pvVar6->benchmark_name,"_stddev");
      std::__cxx11::string::operator=((string *)local_20,(string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::operator=
                ((string *)&local_20->report_label,(string *)&stddev_data_local->report_label);
      local_20->iterations = 0;
      dVar8 = Stat1<double,_long>::StdDev
                        ((Stat1<double,_long> *)&cpu_accumulated_time_stat.sum_squares_);
      local_20->real_accumulated_time = dVar8;
      dVar8 = Stat1<double,_long>::StdDev
                        ((Stat1<double,_long> *)&bytes_per_second_stat.sum_squares_);
      local_20->cpu_accumulated_time = dVar8;
      dVar8 = Stat1<double,_long>::StdDev
                        ((Stat1<double,_long> *)&items_per_second_stat.sum_squares_);
      local_20->bytes_per_second = dVar8;
      dVar8 = Stat1<double,_long>::StdDev((Stat1<double,_long> *)&run_iterations);
      local_20->items_per_second = dVar8;
      return;
    }
    pvVar6 = std::
             vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
             ::operator[]((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                           *)mean_data_local,local_180);
    pvVar7 = std::
             vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
             ::operator[]((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                           *)mean_data_local,0);
    bVar3 = std::operator!=(&pvVar6->report_label,&pvVar7->report_label);
    if (bVar3) {
      std::__cxx11::string::operator=((string *)&stddev_data_local->report_label,"");
      goto LAB_0011bbd4;
    }
    local_180 = local_180 + 1;
  } while( true );
}

Assistant:

void BenchmarkReporter::ComputeStats(
    const std::vector<Run>& reports,
    Run* mean_data, Run* stddev_data) {
  CHECK(reports.size() >= 2) << "Cannot compute stats for less than 2 reports";
  // Accumulators.
  Stat1_d real_accumulated_time_stat;
  Stat1_d cpu_accumulated_time_stat;
  Stat1_d bytes_per_second_stat;
  Stat1_d items_per_second_stat;
  // All repetitions should be run with the same number of iterations so we
  // can take this information from the first benchmark.
  int64_t const run_iterations = reports.front().iterations;

  // Populate the accumulators.
  for (Run const& run : reports) {
    CHECK_EQ(reports[0].benchmark_name, run.benchmark_name);
    CHECK_EQ(run_iterations, run.iterations);
    real_accumulated_time_stat +=
        Stat1_d(run.real_accumulated_time/run.iterations, run.iterations);
    cpu_accumulated_time_stat +=
        Stat1_d(run.cpu_accumulated_time/run.iterations, run.iterations);
    items_per_second_stat += Stat1_d(run.items_per_second, run.iterations);
    bytes_per_second_stat += Stat1_d(run.bytes_per_second, run.iterations);
  }

  // Get the data from the accumulator to BenchmarkReporter::Run's.
  mean_data->benchmark_name = reports[0].benchmark_name + "_mean";
  mean_data->iterations = run_iterations;
  mean_data->real_accumulated_time = real_accumulated_time_stat.Mean() *
                                     run_iterations;
  mean_data->cpu_accumulated_time = cpu_accumulated_time_stat.Mean() *
                                    run_iterations;
  mean_data->bytes_per_second = bytes_per_second_stat.Mean();
  mean_data->items_per_second = items_per_second_stat.Mean();

  // Only add label to mean/stddev if it is same for all runs
  mean_data->report_label = reports[0].report_label;
  for (std::size_t i = 1; i < reports.size(); i++) {
    if (reports[i].report_label != reports[0].report_label) {
      mean_data->report_label = "";
      break;
    }
  }

  stddev_data->benchmark_name = reports[0].benchmark_name + "_stddev";
  stddev_data->report_label = mean_data->report_label;
  stddev_data->iterations = 0;
  stddev_data->real_accumulated_time =
      real_accumulated_time_stat.StdDev();
  stddev_data->cpu_accumulated_time =
      cpu_accumulated_time_stat.StdDev();
  stddev_data->bytes_per_second = bytes_per_second_stat.StdDev();
  stddev_data->items_per_second = items_per_second_stat.StdDev();
}